

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O0

void mask_print(FILE *out,uint32_t *mask,int size)

{
  int local_24;
  int i;
  int rsize;
  int size_local;
  uint32_t *mask_local;
  FILE *out_local;
  
  for (local_24 = 0; local_24 < (size + 0x1f) / 0x20; local_24 = local_24 + 1) {
    if (local_24 != 0) {
      fprintf((FILE *)out," ");
    }
    fprintf((FILE *)out,"%08x",(ulong)mask[local_24]);
  }
  return;
}

Assistant:

void mask_print(FILE *out, uint32_t *mask, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	for (i = 0; i < rsize; i++) {
		if (i)
			fprintf(out, " ");
		fprintf (out, "%08"PRIx32, mask[i]);
	}
}